

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

bool duckdb_re2::IsMatch(Prog *prog,Inst *ip)

{
  InstOp IVar1;
  LogMessage *this;
  ostream *this_00;
  Inst *in_RSI;
  char *in_RDI;
  char *in_stack_fffffffffffffe38;
  Prog *in_stack_fffffffffffffe40;
  LogMessage local_198;
  Inst *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    IVar1 = Prog::Inst::opcode(local_18);
    if (IVar1 < kInstCapture) {
      return false;
    }
    if (IVar1 != kInstCapture) {
      if (IVar1 == kInstEmptyWidth) {
        return false;
      }
      if (IVar1 == kInstMatch) {
        return true;
      }
      if (IVar1 != kInstNop) {
        if (IVar1 == kInstFail) {
          return false;
        }
        LogMessage::LogMessage((LogMessage *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,0);
        this = (LogMessage *)LogMessage::stream(&local_198);
        this_00 = std::operator<<((ostream *)this,"Unexpected opcode in IsMatch: ");
        IVar1 = Prog::Inst::opcode(local_18);
        std::ostream::operator<<(this_00,IVar1);
        LogMessage::~LogMessage(this);
        return false;
      }
    }
    in_stack_fffffffffffffe38 = local_10;
    Prog::Inst::out(local_18);
    local_18 = Prog::inst(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20))
    ;
  } while( true );
}

Assistant:

static bool IsMatch(Prog* prog, Prog::Inst* ip) {
  for (;;) {
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode in IsMatch: " << ip->opcode();
        return false;

      case kInstAlt:
      case kInstAltMatch:
      case kInstByteRange:
      case kInstFail:
      case kInstEmptyWidth:
        return false;

      case kInstCapture:
      case kInstNop:
        ip = prog->inst(ip->out());
        break;

      case kInstMatch:
        return true;
    }
  }
}